

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_sequencer.h
# Opt level: O0

bool __thiscall draco::LinearSequencer::GenerateSequenceInternal(LinearSequencer *this)

{
  reference this_00;
  PointsSequencer *in_RDI;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *unaff_retaddr;
  int i;
  size_type in_stack_ffffffffffffffd8;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_18;
  uint local_14;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (*(int *)&in_RDI[1]._vptr_PointsSequencer < 0) {
    bVar1 = false;
  }
  else {
    PointsSequencer::out_point_ids(in_RDI);
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::resize(unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    for (local_14 = 0; (int)local_14 < *(int *)&in_RDI[1]._vptr_PointsSequencer;
        local_14 = local_14 + 1) {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_18,local_14);
      PointsSequencer::out_point_ids(in_RDI);
      this_00 = std::
                vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                ::at((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                      *)in_RDI,in_stack_ffffffffffffffd8);
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(this_00,&local_18);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool GenerateSequenceInternal() override {
    if (num_points_ < 0) {
      return false;
    }
    out_point_ids()->resize(num_points_);
    for (int i = 0; i < num_points_; ++i) {
      out_point_ids()->at(i) = PointIndex(i);
    }
    return true;
  }